

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ClassDeclarationSyntax::setChild
          (ClassDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  NamedBlockClauseSyntax *pNVar10;
  ImplementsClauseSyntax *pIVar11;
  ParameterPortListSyntax *pPVar12;
  ExtendsClauseSyntax *pEVar13;
  logic_error *this_00;
  long *plVar14;
  char *func;
  size_type *psVar15;
  long *plVar16;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (0xb < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar14 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar14;
    psVar15 = (size_type *)(plVar14 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar15) {
      local_b0.field_2._M_allocated_capacity = *psVar15;
      local_b0.field_2._8_8_ = plVar14[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar15;
    }
    local_b0._M_string_length = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x7dc);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar14;
    plVar16 = plVar14 + 2;
    if (local_90 == plVar16) {
      local_80 = *plVar16;
      lStack_78 = plVar14[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar16;
    }
    local_88 = plVar14[1];
    *plVar14 = (long)plVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar14;
    plVar16 = plVar14 + 2;
    if (local_f0 == plVar16) {
      local_e0 = *plVar16;
      lStack_d8 = plVar14[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar16;
    }
    local_e8 = plVar14[1];
    *plVar14 = (long)plVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar7);
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 1:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->virtualOrInterface).kind = pvVar9->kind;
    (this->virtualOrInterface).field_0x2 = uVar3;
    (this->virtualOrInterface).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->virtualOrInterface).rawLen = uVar5;
    (this->virtualOrInterface).info = pIVar2;
    break;
  case 2:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->classKeyword).kind = pvVar9->kind;
    (this->classKeyword).field_0x2 = uVar3;
    (this->classKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->classKeyword).rawLen = uVar5;
    (this->classKeyword).info = pIVar2;
    break;
  case 3:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->lifetime).kind = pvVar9->kind;
    (this->lifetime).field_0x2 = uVar3;
    (this->lifetime).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->lifetime).rawLen = uVar5;
    (this->lifetime).info = pIVar2;
    break;
  case 4:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->name).kind = pvVar9->kind;
    (this->name).field_0x2 = uVar3;
    (this->name).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->name).rawLen = uVar5;
    (this->name).info = pIVar2;
    break;
  case 5:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pPVar12 = (ParameterPortListSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pPVar12 = (ParameterPortListSyntax *)*ppSVar7;
      if ((pPVar12->super_SyntaxNode).kind != ParameterPortList) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ParameterPortListSyntax]";
LAB_002a805e:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,func);
      }
    }
    this->parameters = pPVar12;
    break;
  case 6:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar13 = (ExtendsClauseSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar13 = (ExtendsClauseSyntax *)*ppSVar7;
      if ((pEVar13->super_SyntaxNode).kind != ExtendsClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ExtendsClauseSyntax]";
        goto LAB_002a805e;
      }
    }
    this->extendsClause = pEVar13;
    break;
  case 7:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pIVar11 = (ImplementsClauseSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pIVar11 = (ImplementsClauseSyntax *)*ppSVar7;
      if ((pIVar11->super_SyntaxNode).kind != ImplementsClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ImplementsClauseSyntax]";
        goto LAB_002a805e;
      }
    }
    this->implementsClause = pIVar11;
    break;
  case 8:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->semi).kind = pvVar9->kind;
    (this->semi).field_0x2 = uVar3;
    (this->semi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi).rawLen = uVar5;
    (this->semi).info = pIVar2;
    break;
  case 9:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar8 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(*ppSVar7);
    (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->items).super_SyntaxListBase.childCount = (pSVar8->super_SyntaxListBase).childCount;
    sVar1 = (pSVar8->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
    (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar8->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
    (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 10:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->endClass).kind = pvVar9->kind;
    (this->endClass).field_0x2 = uVar3;
    (this->endClass).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->endClass).rawLen = uVar5;
    (this->endClass).info = pIVar2;
    break;
  case 0xb:
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar10 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar10 = (NamedBlockClauseSyntax *)*ppSVar7;
      if ((pNVar10->super_SyntaxNode).kind != NamedBlockClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedBlockClauseSyntax]";
        goto LAB_002a805e;
      }
    }
    this->endBlockName = pNVar10;
  }
  return;
}

Assistant:

void ClassDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: virtualOrInterface = child.token(); return;
        case 2: classKeyword = child.token(); return;
        case 3: lifetime = child.token(); return;
        case 4: name = child.token(); return;
        case 5: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 6: extendsClause = child.node() ? &child.node()->as<ExtendsClauseSyntax>() : nullptr; return;
        case 7: implementsClause = child.node() ? &child.node()->as<ImplementsClauseSyntax>() : nullptr; return;
        case 8: semi = child.token(); return;
        case 9: items = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 10: endClass = child.token(); return;
        case 11: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}